

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# runner.c
# Opt level: O0

CgreenVector * sorted_test_items_from(CgreenVector *test_items)

{
  int iVar1;
  int iVar2;
  CgreenVector *pCVar3;
  char *__s2;
  undefined8 uVar4;
  undefined8 in_RDI;
  char *current_test_name;
  int i;
  char *smallest_test_name;
  int smallest;
  CgreenVector *sorted;
  undefined8 in_stack_ffffffffffffffb8;
  CgreenVector *in_stack_ffffffffffffffc0;
  int local_24;
  char *local_20;
  int local_14;
  
  pCVar3 = (CgreenVector *)create_cgreen_vector(destroy_test_item);
  while( true ) {
    iVar1 = cgreen_vector_size(in_RDI);
    if (iVar1 < 2) break;
    local_14 = 0;
    iVar1 = (int)((ulong)in_stack_ffffffffffffffb8 >> 0x20);
    local_20 = test_name_of_element(in_stack_ffffffffffffffc0,iVar1);
    local_24 = 1;
    while( true ) {
      iVar2 = cgreen_vector_size(in_RDI);
      if (iVar2 <= local_24) break;
      __s2 = test_name_of_element(in_stack_ffffffffffffffc0,iVar1);
      iVar2 = strcmp(local_20,__s2);
      if (0 < iVar2) {
        local_14 = local_24;
        local_20 = test_name_of_element(in_stack_ffffffffffffffc0,iVar1);
      }
      local_24 = local_24 + 1;
    }
    in_stack_ffffffffffffffc0 = pCVar3;
    cgreen_vector_remove(in_RDI,local_14);
    cgreen_vector_add(in_stack_ffffffffffffffc0);
  }
  iVar1 = cgreen_vector_size(in_RDI);
  if (iVar1 == 1) {
    uVar4 = cgreen_vector_remove(in_RDI,0);
    cgreen_vector_add(pCVar3,uVar4);
    destroy_cgreen_vector(in_RDI);
  }
  return pCVar3;
}

Assistant:

static CgreenVector *sorted_test_items_from(CgreenVector *test_items) {
    CgreenVector *sorted = create_cgreen_vector((GenericDestructor)destroy_test_item);
    while (cgreen_vector_size(test_items) > 1) {
        int smallest = 0;
        const char *smallest_test_name = test_name_of_element(test_items, smallest);
        for (int i=1; i<cgreen_vector_size(test_items); i++) {
            const char *current_test_name = test_name_of_element(test_items, i);
            if (strcmp(smallest_test_name, current_test_name) > 0) {
                smallest = i;
                smallest_test_name = test_name_of_element(test_items, smallest);
            }
        }
        cgreen_vector_add(sorted, cgreen_vector_remove(test_items, smallest));
    }
    if (cgreen_vector_size(test_items) == 1) {
        cgreen_vector_add(sorted, cgreen_vector_remove(test_items, 0));
        destroy_cgreen_vector(test_items);
    }
    return sorted;
}